

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  sqlite3_module *pTokenizer;
  sqlite3_tokenizer_module *psVar2;
  Fts3PhraseToken *pFVar3;
  int iVar4;
  int iVar5;
  Mem *pMem;
  i64 iDocid;
  uchar *z;
  Fts3DeferredToken *pFVar6;
  ulong iCol;
  long in_FS_OFFSET;
  bool bVar7;
  int rc;
  int iDum2;
  int iDum1;
  int nToken;
  char *zToken;
  sqlite3_tokenizer_cursor *pTC;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  sqlite3_tokenizer_cursor *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_64 = *pRc;
  if (local_64 == 0) {
    if ((pCsr->pDeferred != (Fts3DeferredToken *)0x0) &&
       (local_64 = fts3CursorSeek((sqlite3_context *)0x0,pCsr), local_64 == 0)) {
      local_3c = 0;
      iVar5 = local_3c;
      if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
        psVar1 = (pCsr->base).pVtab;
        pStmt = pCsr->pStmt;
        pTokenizer = psVar1[3].pModule;
        psVar2 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
        pMem = columnMem(pStmt,0);
        iDocid = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        if (0 < *(int *)&psVar1[2].pModule) {
          iCol = 0;
          do {
            if (psVar1[2].zErrMsg[iCol] == '\0') {
              z = sqlite3_column_text(pCsr->pStmt,(int)iCol + 1);
              local_48 = (sqlite3_tokenizer_cursor *)0x0;
              iVar5 = sqlite3Fts3OpenTokenizer
                                ((sqlite3_tokenizer *)pTokenizer,pCsr->iLangid,(char *)z,-1,
                                 &local_48);
              while (local_3c = iVar5, iVar5 == 0) {
                local_50 = &DAT_aaaaaaaaaaaaaaaa;
                local_54 = 0;
                local_58 = 0;
                local_5c = 0;
                local_60 = 0;
                local_3c = (*psVar2->xNext)(local_48,&local_50,&local_54,&local_58,&local_5c,
                                            &local_60);
                pFVar6 = pCsr->pDeferred;
                iVar4 = local_60;
                while ((iVar5 = local_3c, local_60 = iVar4, pFVar6 != (Fts3DeferredToken *)0x0 &&
                       (local_3c == 0))) {
                  pFVar3 = pFVar6->pToken;
                  if (((iCol == (uint)pFVar6->iCol) || (*(int *)&psVar1[2].pModule <= pFVar6->iCol))
                     && (iVar4 == 0 || pFVar3->bFirst == 0)) {
                    iVar5 = pFVar3->n;
                    if (((iVar5 == local_54) || ((iVar5 < local_54 && (pFVar3->isPrefix != 0)))) &&
                       (iVar5 = bcmp(local_50,pFVar3->z,(long)iVar5), iVar5 == 0)) {
                      fts3PendingListAppend(&pFVar6->pList,iDocid,iCol,(long)iVar4,&local_3c);
                    }
                  }
                  pFVar6 = pFVar6->pNext;
                  iVar4 = local_60;
                }
              }
              if (local_48 != (sqlite3_tokenizer_cursor *)0x0) {
                (*psVar2->xClose)(local_48);
              }
              if (iVar5 == 0x65) {
                local_3c = 0;
              }
            }
            iCol = iCol + 1;
          } while (((long)iCol < (long)*(int *)&psVar1[2].pModule) && (local_3c == 0));
        }
        pFVar6 = pCsr->pDeferred;
        iVar5 = local_3c;
        if (local_3c == 0 && pFVar6 != (Fts3DeferredToken *)0x0) {
          do {
            if (pFVar6->pList != (PendingList *)0x0) {
              iVar5 = fts3PendingListAppendVarint(&pFVar6->pList,0);
            }
            pFVar6 = pFVar6->pNext;
          } while ((pFVar6 != (Fts3DeferredToken *)0x0) && (iVar5 == 0));
        }
      }
      local_3c = iVar5;
      local_64 = local_3c;
    }
    iVar5 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&local_64);
    bVar7 = iVar5 == 0;
    for (pFVar6 = pCsr->pDeferred; pFVar6 != (Fts3DeferredToken *)0x0; pFVar6 = pFVar6->pNext) {
      sqlite3_free(pFVar6->pList);
      pFVar6->pList = (PendingList *)0x0;
    }
    *pRc = local_64;
  }
  else {
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)(byte)(local_64 == 0 & bVar7);
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()).
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}